

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O1

int __thiscall ncnn::Yolov3DetectionOutput::load_param(Yolov3DetectionOutput *this,ParamDict *pd)

{
  int *piVar1;
  void *pvVar2;
  Allocator *pAVar3;
  int iVar4;
  float fVar5;
  Mat local_c8;
  Mat local_78;
  
  iVar4 = ParamDict::get(pd,0,0x14);
  this->num_class = iVar4;
  iVar4 = ParamDict::get(pd,1,5);
  this->num_box = iVar4;
  fVar5 = ParamDict::get(pd,2,0.01);
  this->confidence_threshold = fVar5;
  fVar5 = ParamDict::get(pd,3,0.45);
  this->nms_threshold = fVar5;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  ParamDict::get(&local_c8,pd,4,&local_78);
  if (&this->biases != &local_c8) {
    piVar1 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (this->biases).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pvVar2 = (this->biases).data;
        pAVar3 = (this->biases).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
        }
        else {
          (*pAVar3->_vptr_Allocator[3])();
        }
      }
    }
    (this->biases).cstep = 0;
    *(undefined8 *)((long)&(this->biases).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->biases).elemsize + 4) = 0;
    (this->biases).data = (void *)0x0;
    (this->biases).refcount = (int *)0x0;
    (this->biases).dims = 0;
    (this->biases).w = 0;
    (this->biases).h = 0;
    (this->biases).d = 0;
    (this->biases).c = 0;
    (this->biases).data = local_c8.data;
    (this->biases).refcount = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    (this->biases).elemsize = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
    (this->biases).elempack = local_c8.elempack;
    (this->biases).allocator = local_c8.allocator;
    (this->biases).dims = local_c8.dims;
    (this->biases).w = local_c8.w;
    (this->biases).h = local_c8.h;
    (this->biases).d = local_c8.d;
    (this->biases).c = local_c8.c;
    (this->biases).cstep = local_c8.cstep;
  }
  piVar1 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elemsize._4_4_ = 0;
  local_c8.elempack = 0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  piVar1 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  ParamDict::get(&local_c8,pd,5,&local_78);
  if (&this->mask != &local_c8) {
    piVar1 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (this->mask).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pvVar2 = (this->mask).data;
        pAVar3 = (this->mask).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
        }
        else {
          (*pAVar3->_vptr_Allocator[3])();
        }
      }
    }
    (this->mask).cstep = 0;
    *(undefined8 *)((long)&(this->mask).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->mask).elemsize + 4) = 0;
    (this->mask).data = (void *)0x0;
    (this->mask).refcount = (int *)0x0;
    (this->mask).dims = 0;
    (this->mask).w = 0;
    (this->mask).h = 0;
    (this->mask).d = 0;
    (this->mask).c = 0;
    (this->mask).data = local_c8.data;
    (this->mask).refcount = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    (this->mask).elemsize = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
    (this->mask).elempack = local_c8.elempack;
    (this->mask).allocator = local_c8.allocator;
    (this->mask).dims = local_c8.dims;
    (this->mask).w = local_c8.w;
    (this->mask).h = local_c8.h;
    (this->mask).d = local_c8.d;
    (this->mask).c = local_c8.c;
    (this->mask).cstep = local_c8.cstep;
  }
  piVar1 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elemsize._4_4_ = 0;
  local_c8.elempack = 0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  piVar1 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  ParamDict::get(&local_c8,pd,6,&local_78);
  if (&this->anchors_scale != &local_c8) {
    piVar1 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (this->anchors_scale).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pvVar2 = (this->anchors_scale).data;
        pAVar3 = (this->anchors_scale).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
        }
        else {
          (*pAVar3->_vptr_Allocator[3])();
        }
      }
    }
    (this->anchors_scale).cstep = 0;
    *(undefined8 *)((long)&(this->anchors_scale).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->anchors_scale).elemsize + 4) = 0;
    (this->anchors_scale).data = (void *)0x0;
    (this->anchors_scale).refcount = (int *)0x0;
    (this->anchors_scale).dims = 0;
    (this->anchors_scale).w = 0;
    (this->anchors_scale).h = 0;
    (this->anchors_scale).d = 0;
    (this->anchors_scale).c = 0;
    (this->anchors_scale).data = local_c8.data;
    (this->anchors_scale).refcount =
         (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    (this->anchors_scale).elemsize = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize)
    ;
    (this->anchors_scale).elempack = local_c8.elempack;
    (this->anchors_scale).allocator = local_c8.allocator;
    (this->anchors_scale).dims = local_c8.dims;
    (this->anchors_scale).w = local_c8.w;
    (this->anchors_scale).h = local_c8.h;
    (this->anchors_scale).d = local_c8.d;
    (this->anchors_scale).c = local_c8.c;
    (this->anchors_scale).cstep = local_c8.cstep;
  }
  piVar1 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elemsize._4_4_ = 0;
  local_c8.elempack = 0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  piVar1 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return 0;
}

Assistant:

int Yolov3DetectionOutput::load_param(const ParamDict& pd)
{
    num_class = pd.get(0, 20);
    num_box = pd.get(1, 5);
    confidence_threshold = pd.get(2, 0.01f);
    nms_threshold = pd.get(3, 0.45f);
    biases = pd.get(4, Mat());
    mask = pd.get(5, Mat());
    anchors_scale = pd.get(6, Mat());
    return 0;
}